

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cc
# Opt level: O3

void __thiscall
iqxmlrpc::Pool_executor_factory::Pool_executor_factory(Pool_executor_factory *this,uint numthreads)

{
  (this->super_Executor_factory_base)._vptr_Executor_factory_base =
       (_func_int **)&PTR__Pool_executor_factory_00188520;
  boost::thread_group::thread_group(&this->threads);
  (this->req_queue).
  super__Deque_base<iqxmlrpc::Pool_executor_*,_std::allocator<iqxmlrpc::Pool_executor_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->req_queue).
  super__Deque_base<iqxmlrpc::Pool_executor_*,_std::allocator<iqxmlrpc::Pool_executor_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->req_queue).
  super__Deque_base<iqxmlrpc::Pool_executor_*,_std::allocator<iqxmlrpc::Pool_executor_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->req_queue).
  super__Deque_base<iqxmlrpc::Pool_executor_*,_std::allocator<iqxmlrpc::Pool_executor_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->req_queue).
  super__Deque_base<iqxmlrpc::Pool_executor_*,_std::allocator<iqxmlrpc::Pool_executor_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->req_queue).
  super__Deque_base<iqxmlrpc::Pool_executor_*,_std::allocator<iqxmlrpc::Pool_executor_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->req_queue).
  super__Deque_base<iqxmlrpc::Pool_executor_*,_std::allocator<iqxmlrpc::Pool_executor_*>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->req_queue).
  super__Deque_base<iqxmlrpc::Pool_executor_*,_std::allocator<iqxmlrpc::Pool_executor_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->pool).
  super__Vector_base<iqxmlrpc::Pool_executor_factory::Pool_thread_*,_std::allocator<iqxmlrpc::Pool_executor_factory::Pool_thread_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->req_queue).
  super__Deque_base<iqxmlrpc::Pool_executor_*,_std::allocator<iqxmlrpc::Pool_executor_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->pool).
  super__Vector_base<iqxmlrpc::Pool_executor_factory::Pool_thread_*,_std::allocator<iqxmlrpc::Pool_executor_factory::Pool_thread_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pool).
  super__Vector_base<iqxmlrpc::Pool_executor_factory::Pool_thread_*,_std::allocator<iqxmlrpc::Pool_executor_factory::Pool_thread_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->req_queue).
  super__Deque_base<iqxmlrpc::Pool_executor_*,_std::allocator<iqxmlrpc::Pool_executor_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<iqxmlrpc::Pool_executor_*,_std::allocator<iqxmlrpc::Pool_executor_*>_>::
  _M_initialize_map(&(this->req_queue).
                     super__Deque_base<iqxmlrpc::Pool_executor_*,_std::allocator<iqxmlrpc::Pool_executor_*>_>
                    ,0);
  boost::mutex::mutex(&this->req_queue_lock);
  boost::condition_variable_any::condition_variable_any(&this->req_queue_cond);
  this->in_destructor = false;
  boost::mutex::mutex(&this->destructor_lock);
  add_threads(this,numthreads);
  return;
}

Assistant:

Pool_executor_factory::Pool_executor_factory(unsigned numthreads):
  in_destructor(false)
{
  add_threads(numthreads);
}